

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.cpp
# Opt level: O0

int __thiscall ncnn::Quantize::load_model(Quantize *this,ModelBin *mb)

{
  bool bVar1;
  long *in_RSI;
  Mat *in_RDI;
  Mat *this_00;
  Mat local_60;
  int local_4;
  
  this_00 = &local_60;
  (**(code **)(*in_RSI + 0x10))(this_00,in_RSI,(int)in_RDI[2].cstep,1);
  ncnn::Mat::operator=(this_00,in_RDI);
  ncnn::Mat::~Mat((Mat *)0x6b8aa0);
  bVar1 = ncnn::Mat::empty(in_RDI);
  if (bVar1) {
    local_4 = -100;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int Quantize::load_model(const ModelBin& mb)
{
    scale_data = mb.load(scale_data_size, 1);
    if (scale_data.empty())
        return -100;

    return 0;
}